

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.h
# Opt level: O2

void __thiscall ser::DataFieldInfo::DataFieldInfo(DataFieldInfo *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->type_)._M_dataplus._M_p = (pointer)&(this->type_).field_2;
  (this->type_)._M_string_length = 0;
  (this->type_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->type_);
  this->bytesPerElement_ = 0;
  this->rank_ = 0;
  this->iSize_ = 1;
  this->jSize_ = 1;
  this->kSize_ = 1;
  this->lSize_ = 1;
  this->iPlusHalo_ = 0;
  this->iMinusHalo_ = 0;
  this->jPlusHalo_ = 0;
  this->jMinusHalo_ = 0;
  this->kPlusHalo_ = 0;
  this->kMinusHalo_ = 0;
  this->lPlusHalo_ = 0;
  this->lMinusHalo_ = 0;
  return;
}

Assistant:

DataFieldInfo()
        {
            name_ = "";
            type_ = "";
            bytesPerElement_ = 0;
            rank_ = 0;
            iSize_ = 1;
            jSize_ = 1;
            kSize_ = 1;
            lSize_ = 1;
            iPlusHalo_ = 0;
            jPlusHalo_ = 0;
            kPlusHalo_ = 0;
            lPlusHalo_ = 0;
            iMinusHalo_ = 0;
            jMinusHalo_ = 0;
            kMinusHalo_ = 0;
            lMinusHalo_ = 0;
        }